

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

ValueType __thiscall
wabt::interp::Thread::TraceSource::GetLocalType(TraceSource *this,Index stack_slot)

{
  int iVar1;
  size_type sVar2;
  DefinedFunc *pDVar3;
  FuncType *pFVar4;
  size_type sVar5;
  FuncDesc *this_00;
  ValueType VVar6;
  Index local_index;
  undefined1 local_40 [8];
  Ptr func;
  Frame *frame;
  Index stack_slot_local;
  TraceSource *this_local;
  
  func.root_index_ =
       (Index)std::vector<wabt::interp::Frame,_std::allocator<wabt::interp::Frame>_>::back
                        (&this->thread_->frames_);
  RefPtr<wabt::interp::DefinedFunc>::RefPtr
            ((RefPtr<wabt::interp::DefinedFunc> *)local_40,this->thread_->store_,
             (Ref)(((reference)func.root_index_)->func).index);
  sVar2 = std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::size
                    (&this->thread_->values_);
  iVar1 = *(int *)(func.root_index_ + 8);
  pDVar3 = RefPtr<wabt::interp::DefinedFunc>::operator->
                     ((RefPtr<wabt::interp::DefinedFunc> *)local_40);
  pFVar4 = Func::type(&pDVar3->super_Func);
  sVar5 = std::vector<wabt::Type,_std::allocator<wabt::Type>_>::size(&pFVar4->params);
  pDVar3 = RefPtr<wabt::interp::DefinedFunc>::operator->
                     ((RefPtr<wabt::interp::DefinedFunc> *)local_40);
  this_00 = DefinedFunc::desc(pDVar3);
  VVar6 = FuncDesc::GetLocalType(this_00,(((int)sVar2 - iVar1) + (int)sVar5) - stack_slot);
  RefPtr<wabt::interp::DefinedFunc>::~RefPtr((RefPtr<wabt::interp::DefinedFunc> *)local_40);
  return VVar6;
}

Assistant:

ValueType Thread::TraceSource::GetLocalType(Index stack_slot) {
  const Frame& frame = thread_->frames_.back();
  DefinedFunc::Ptr func{thread_->store_, frame.func};
  // When a function is called, the arguments are first pushed on the stack by
  // the caller, then the new call frame is pushed (which caches the current
  // height of the value stack). At that point, any local variables will be
  // allocated on the stack. For example, a function that has two parameters
  // and one local variable will have a stack like this:
  //
  //                 frame.values      top of stack
  //                 v                 v
  //   param1 param2 | local1 ..........
  //
  // When the instruction stream is generated, all local variable access is
  // translated into a value relative to the top of the stack, counting up from
  // 1. So in the previous example, if there are three values above the local
  // variable, the stack looks like:
  //
  //              param1 param2 | local1 value1 value2 value3
  // stack slot:    6      5        4      3      2      1
  // local index:   0      1        2
  //
  // local1 can be accessed with stack_slot 4, and param1 can be accessed with
  // stack_slot 6. The formula below takes these values into account to convert
  // the stack_slot into a local index.
  Index local_index =
      (thread_->values_.size() - frame.values + func->type().params.size()) -
      stack_slot;
  return func->desc().GetLocalType(local_index);
}